

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForTopFunction(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  OpndKind OVar4;
  byte scale;
  JITTimeFunctionBody *pJVar5;
  RegOpnd *baseOpnd;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  int iVar8;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar5);
  if (bVar2) {
    baseOpnd = LoadGeneratorArgsPtr(ldElem);
  }
  else {
    baseOpnd = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar5);
  if (bVar2) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::IsGenerator(pJVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5666,
                         "(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator())",
                         "actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator()");
      if (!bVar3) goto LAB_005ed014;
      *puVar6 = 0;
    }
  }
  iVar8 = (uint)!bVar2 * 4 + 1;
  OVar4 = IR::Opnd::GetKind(valueOpnd);
  if (OVar4 == OpndKindIntConst) {
    OVar4 = IR::Opnd::GetKind(valueOpnd);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) {
LAB_005ed014:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pIVar7 = IR::IndirOpnd::New(baseOpnd,(iVar8 + *(int *)&valueOpnd[1]._vptr_Opnd) * 8,TyInt64,
                                this->m_func,false);
    return pIVar7;
  }
  scale = LowererMDArch::GetDefaultIndirScale();
  OVar4 = IR::Opnd::GetKind(&baseOpnd->super_Opnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005ed014;
    *puVar6 = 0;
  }
  OVar4 = IR::Opnd::GetKind(valueOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005ed014;
    *puVar6 = 0;
  }
  pIVar7 = IR::IndirOpnd::New(baseOpnd,(RegOpnd *)valueOpnd,scale,TyInt64,this->m_func);
  pIVar7->m_offset = iVar8 << (scale & 0x1f);
  (pIVar7->super_Opnd).field_0xe = 0;
  return pIVar7;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForTopFunction(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    // Load argument set dst = [ebp + index] (or grab from the generator object if m_func is a generator function).
    IR::RegOpnd *baseOpnd = m_func->GetJITFunctionBody()->IsCoroutine() ? LoadGeneratorArgsPtr(ldElem) : IR::Opnd::CreateFramePointerOpnd(m_func);
    IR::IndirOpnd* argIndirOpnd = nullptr;
    // The stack looks like this:
    //       ...
    //       arguments[1]
    //       arguments[0]
    //       this
    //       callinfo
    //       function object
    //       return addr
    // EBP-> EBP chain

    //actual arguments offset is LowererMD::GetFormalParamOffset() + 1 (this)

    uint16 actualOffset = m_func->GetJITFunctionBody()->IsCoroutine() ? 1 : GetFormalParamOffset() + 1; //5
    Assert(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator());
    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = (valueOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
    }
    else
    {
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd->AsRegOpnd(), valueOpnd->AsRegOpnd(), indirScale, TyMachReg, this->m_func);

        // Need to offset valueOpnd by 5. Instead of changing valueOpnd, we can just add an offset to the indir. Changing
        // valueOpnd requires creation of a temp sym (if it's not already a temp) so that the value of the sym that
        // valueOpnd represents is not changed.
        argIndirOpnd->SetOffset(actualOffset << indirScale);
    }
    return argIndirOpnd;
}